

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev-lang-demo.cpp
# Opt level: O0

void sensor_menu(void)

{
  bool bVar1;
  ostream *poVar2;
  void *this;
  sensor *in_stack_00000008;
  sensor *s;
  uint i;
  char c;
  sensor *in_stack_fffffffffffffcc0;
  undefined1 *local_320;
  sensor *in_stack_fffffffffffffd08;
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  undefined1 *local_1c8;
  uint local_1c0;
  char local_1bb [2];
  allocator local_1b9;
  string local_1b8 [39];
  allocator local_191;
  string local_190 [8];
  address_type *in_stack_fffffffffffffe78;
  sensor *in_stack_fffffffffffffe80;
  sensor *in_stack_fffffffffffffe90;
  string local_168 [55];
  allocator local_131;
  string local_130 [32];
  undefined1 *local_110;
  undefined1 local_108 [64];
  undefined1 local_c8 [64];
  undefined1 local_88 [64];
  undefined1 local_48 [64];
  undefined1 auStack_8 [8];
  
  local_1bb[1] = 1;
  local_110 = local_108;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"ev3-ports:in1",&local_131);
  ev3dev::sensor::sensor(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  local_110 = local_c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"ev3-ports:in2",(allocator *)&stack0xfffffffffffffe97);
  ev3dev::sensor::sensor(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  local_110 = local_88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"ev3-ports:in3",&local_191);
  ev3dev::sensor::sensor(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  local_110 = local_48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"ev3-ports:in4",&local_1b9);
  ev3dev::sensor::sensor(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  local_1bb[1] = 0;
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe97);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  local_1bb[0] = '\0';
  do {
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"*** sensor menu ***");
    this = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    for (local_1c0 = 0; local_1c0 < 4; local_1c0 = local_1c0 + 1) {
      local_1c8 = local_108 + (ulong)local_1c0 * 0x40;
      bVar1 = ev3dev::device::connected((device *)0x124fd7);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"(");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1c0 + 1);
        poVar2 = std::operator<<(poVar2,") ");
        ev3dev::sensor::type_name_abi_cxx11_(in_stack_00000008);
        poVar2 = std::operator<<(poVar2,local_1e8);
        poVar2 = std::operator<<(poVar2," (device ");
        ev3dev::sensor::driver_name_abi_cxx11_(in_stack_fffffffffffffd08);
        poVar2 = std::operator<<(poVar2,local_208);
        poVar2 = std::operator<<(poVar2,", port ");
        ev3dev::sensor::address_abi_cxx11_(in_stack_fffffffffffffd08);
        poVar2 = std::operator<<(poVar2,local_228);
        poVar2 = std::operator<<(poVar2,", mode ");
        ev3dev::sensor::mode_abi_cxx11_(in_stack_fffffffffffffd08);
        poVar2 = std::operator<<(poVar2,local_248);
        in_stack_fffffffffffffd08 = (sensor *)std::operator<<(poVar2,")");
        std::ostream::operator<<(in_stack_fffffffffffffd08,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_248);
        std::__cxx11::string::~string(local_228);
        std::__cxx11::string::~string(local_208);
        std::__cxx11::string::~string(local_1e8);
      }
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"(b)ack");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::operator<<(poVar2,"Choice: ");
    std::operator>>((istream *)&std::cin,local_1bb);
    if ((int)local_1bb[0] - 0x31U < 4) {
      sensor_action(in_stack_fffffffffffffe90);
    }
  } while (local_1bb[0] != 'b');
  local_320 = auStack_8;
  do {
    local_320 = local_320 + -0x40;
    ev3dev::sensor::~sensor(in_stack_fffffffffffffcc0);
  } while (local_320 != local_108);
  return;
}

Assistant:

void sensor_menu()
{
  sensor arrSensors[4] {
    { INPUT_1 },
    { INPUT_2 },
    { INPUT_3 },
    { INPUT_4 }
  };

  char c = 0;
  do
  {
    cout << endl
         << "*** sensor menu ***" << endl
         << endl;

    for (unsigned i=0; i<4; ++i)
    {
      sensor &s = arrSensors[i];
      if (s.connected())
      {
        cout << "(" << i+1 << ") " << s.type_name() << " (device " << s.driver_name()
             << ", port " << s.address() << ", mode " << s.mode() << ")" << endl;
      }
    }
    cout << endl;
    cout << "(b)ack"  << endl;
    cout << endl
         << "Choice: ";
    cin >> c;

    switch (c)
    {
    case '1':
    case '2':
    case '3':
    case '4':
      sensor_action(arrSensors[c-'1']);
      break;
    }
  }
  while (c != 'b');
}